

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

string * __thiscall
crsGA::LogHandler::toDateTime_abi_cxx11_
          (string *__return_storage_ptr__,LogHandler *this,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *when)

{
  char *__s;
  string local_60 [54];
  allocator<char> local_2a;
  undefined1 local_29;
  time_t local_28;
  time_t t;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *when_local;
  LogHandler *this_local;
  string *dateTime;
  
  t = (time_t)when;
  when_local = (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)this;
  this_local = (LogHandler *)__return_storage_ptr__;
  local_28 = std::chrono::_V2::system_clock::to_time_t(when);
  local_29 = 0;
  __s = ctime(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_2a)
  ;
  std::allocator<char>::~allocator(&local_2a);
  std::__cxx11::string::substr((ulong)local_60,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_60);
  std::__cxx11::string::~string(local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string LogHandler::toDateTime(const std::chrono::time_point<std::chrono::system_clock>& when)
{
    auto t = std::chrono::system_clock::to_time_t(when);
    auto dateTime = std::string(std::ctime(&t));
    dateTime = dateTime.substr(0, 24);
    return dateTime;
}